

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::colSingletons(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this)

{
  uint *puVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  int p_col;
  int iVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  int *piVar12;
  int *piVar13;
  pointer pnVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  int *piVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  int *piVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  if (0 < (this->temp).stage) {
    piVar6 = (this->row).orig;
    piVar7 = (this->row).perm;
    piVar8 = (this->temp).s_mark;
    lVar21 = 0;
    do {
      iVar3 = piVar6[lVar21];
      lVar26 = (long)(this->u).row.len[iVar3];
      if (0 < lVar26) {
        iVar4 = (this->u).row.start[iVar3];
        piVar9 = (this->u).row.idx;
        lVar29 = 0;
        do {
          p_col = piVar9[iVar4 + lVar29];
          piVar10 = (this->u).col.idx;
          piVar11 = (this->u).col.start;
          piVar12 = (this->u).col.len;
          piVar13 = (this->temp).s_cact;
          iVar24 = (piVar12[p_col] + piVar11[p_col]) - piVar13[p_col];
          piVar18 = piVar10 + iVar24;
          do {
            piVar25 = piVar18;
            piVar18 = piVar25 + 1;
          } while (*piVar25 != iVar3);
          *piVar25 = piVar10[iVar24];
          piVar10[iVar24] = iVar3;
          iVar24 = piVar13[p_col];
          piVar13[p_col] = iVar24 + -1;
          if (iVar24 == 2) {
            iVar24 = piVar12[p_col];
            piVar12[p_col] = iVar24 + -1;
            iVar24 = piVar10[(long)piVar11[p_col] + (long)iVar24 + -1];
            if (-1 < piVar7[iVar24]) goto LAB_0027e05f;
            piVar10 = (this->u).row.len;
            iVar23 = piVar10[iVar24] + -1;
            iVar5 = (this->u).row.start[iVar24];
            piVar10[iVar24] = iVar23;
            lVar22 = (long)(iVar5 + iVar23);
            lVar19 = lVar22 * 4;
            lVar20 = lVar22 * 0x38 + 0x68;
            do {
              lVar28 = lVar20;
              lVar27 = lVar19;
              lVar19 = lVar27 + -4;
              lVar20 = lVar28 + -0x38;
            } while (*(int *)((long)(this->u).row.idx + lVar27) != p_col);
            pnVar14 = (this->u).row.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_68.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)((long)(&pnVar14[-2].m_backend.data + 1) + lVar28);
            puVar1 = (uint *)((long)pnVar14[-2].m_backend.data._M_elems + lVar28 + 8);
            local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
            local_68.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
            puVar1 = (uint *)((long)pnVar14[-2].m_backend.data._M_elems + lVar28 + 0x18);
            local_68.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
            local_68.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
            local_68.m_backend.exp = *(int *)((long)(&pnVar14[-2].m_backend.data + 1) + 8U + lVar28)
            ;
            local_68.m_backend.neg =
                 *(bool *)((long)(&pnVar14[-2].m_backend.data + 1) + 0xcU + lVar28);
            local_68.m_backend._48_8_ =
                 *(undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar28);
            setPivot(this,(this->temp).stage,p_col,iVar24,&local_68);
            iVar24 = (this->temp).stage;
            (this->temp).stage = iVar24 + 1;
            piVar8[iVar24] = p_col;
            pnVar14 = (this->u).row.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            *(undefined8 *)((long)(&pnVar14[-2].m_backend.data + 1) + lVar28) =
                 *(undefined8 *)((long)pnVar14[lVar22].m_backend.data._M_elems + 0x20);
            uVar15 = *(undefined8 *)pnVar14[lVar22].m_backend.data._M_elems;
            uVar16 = *(undefined8 *)((long)pnVar14[lVar22].m_backend.data._M_elems + 8);
            puVar1 = (uint *)((long)pnVar14[lVar22].m_backend.data._M_elems + 0x10);
            uVar17 = *(undefined8 *)(puVar1 + 2);
            puVar2 = (undefined8 *)((long)pnVar14[-2].m_backend.data._M_elems + lVar28 + 0x18);
            *puVar2 = *(undefined8 *)puVar1;
            puVar2[1] = uVar17;
            puVar2 = (undefined8 *)((long)pnVar14[-2].m_backend.data._M_elems + lVar28 + 8);
            *puVar2 = uVar15;
            puVar2[1] = uVar16;
            *(int *)((long)(&pnVar14[-2].m_backend.data + 1) + 8U + lVar28) =
                 pnVar14[lVar22].m_backend.exp;
            *(bool *)((long)(&pnVar14[-2].m_backend.data + 1) + 0xcU + lVar28) =
                 pnVar14[lVar22].m_backend.neg;
            *(undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar28) =
                 *(undefined8 *)&pnVar14[lVar22].m_backend.fpclass;
            piVar10 = (this->u).row.idx;
            *(int *)((long)piVar10 + lVar27) = piVar10[lVar22];
          }
          else if (iVar24 == 1) {
LAB_0027e05f:
            this->stat = SINGULAR;
            return;
          }
          lVar29 = lVar29 + 1;
        } while (lVar29 != lVar26);
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 < (this->temp).stage);
  }
  return;
}

Assistant:

void CLUFactor<R>::colSingletons()
{
   int i, j, k, n;
   int len;
   int p_col, p_row, newrow;
   int* idx;
   int* rorig = row.orig;
   int* rperm = row.perm;
   int* sing = temp.s_mark;


   /*  Iteratively update column counts due to removed column singletons
    *  thereby removing new arising columns singletons
    *  and computing the index of the first row singleton (-1)
    *  until no more can be found.
    */

   for(i = 0; i < temp.stage; ++i)
   {
      p_row = rorig[i];
      assert(p_row >= 0);
      idx = &(u.row.idx[u.row.start[p_row]]);
      len = u.row.len[p_row];

      for(j = 0; j < len; ++j)
      {
         /*  Move pivotal nonzeros to front of column.
          */
         p_col = idx[j];
         assert(temp.s_cact[p_col] > 0);

         n = u.col.start[p_col] + u.col.len[p_col] - temp.s_cact[p_col];

         for(k = n; u.col.idx[k] != p_row; ++k)
            ;

         assert(k < u.col.start[p_col] + u.col.len[p_col]);

         u.col.idx[k] = u.col.idx[n];

         u.col.idx[n] = p_row;

         n = --(temp.s_cact[p_col]);          /* column nonzeros of ACTIVE matrix */

         if(n == 1)                   /* Here is another singleton */
         {
            newrow = u.col.idx[--u.col.len[p_col] + u.col.start[p_col]];

            /*      Ensure, matrix not singular
             */

            if(rperm[newrow] >= 0)
            {
               this->stat = SLinSolver<R>::SINGULAR;
               return;
            }

            /*      Find singleton in row.
             */
            n = u.row.start[newrow] + (--(u.row.len[newrow]));

            for(k = n; u.row.idx[k] != p_col; --k)
               ;

            /*      Remove singleton from column.
             */
            setPivot(temp.stage, p_col, newrow, u.row.val[k]);

            sing[temp.stage++] = p_col;

            /*      Move pivot element to diag.
             */
            u.row.val[k] = u.row.val[n];

            u.row.idx[k] = u.row.idx[n];
         }
         else if(n == 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }
      }
   }

   assert(temp.stage <= thedim);
}